

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  size_t in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      in_stack_ffffffffffffffe0 =
           (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x4;
    }
    else {
      in_stack_ffffffffffffffe0 =
           (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(*(long *)(in_RDI + 0x10) << 1);
    }
    reserve(unaff_retaddr,in_RDI);
  }
  pmr::polymorphic_allocator<std::__cxx11::string>::
  construct<std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a4c18);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }